

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

void * stbi__psd_load(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri,
                     int bpc)

{
  byte bVar1;
  ushort uVar2;
  char cVar3;
  stbi__uint16 sVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  stbi__uint32 sVar10;
  uint uVar11;
  int iVar12;
  char *pcVar13;
  stbi__uint16 *data;
  long lVar14;
  stbi_uc *psVar15;
  stbi_uc sVar16;
  uint x_00;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  uint uVar20;
  uint y_00;
  stbi__uint16 *psVar21;
  stbi__uint16 *psVar22;
  long in_FS_OFFSET;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  int iVar34;
  int iVar35;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  float fVar66;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  int iVar85;
  float fVar86;
  int iVar93;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  int iVar94;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar95 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  stbi__uint16 *local_80;
  stbi__uint16 *local_68;
  
  iVar5 = stbi__get16be(s);
  uVar6 = stbi__get16be(s);
  if ((uVar6 | iVar5 << 0x10) != 0x38425053) {
    pcVar13 = "not PSD";
    goto LAB_0010b953;
  }
  iVar5 = stbi__get16be(s);
  if (iVar5 != 1) {
    pcVar13 = "wrong version";
    goto LAB_0010b953;
  }
  if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
    psVar15 = s->img_buffer;
LAB_0010b8d7:
    s->img_buffer = psVar15 + 6;
  }
  else {
    psVar15 = s->img_buffer;
    iVar5 = (int)s->img_buffer_end - (int)psVar15;
    if (5 < iVar5) goto LAB_0010b8d7;
    s->img_buffer = s->img_buffer_end;
    (*(s->io).skip)(s->io_user_data,6 - iVar5);
  }
  uVar6 = stbi__get16be(s);
  if (0x10 < uVar6) {
    pcVar13 = "wrong channel count";
    goto LAB_0010b953;
  }
  iVar5 = stbi__get16be(s);
  uVar20 = iVar5 * 0x10000;
  uVar7 = stbi__get16be(s);
  y_00 = uVar20 + uVar7;
  iVar5 = stbi__get16be(s);
  uVar8 = stbi__get16be(s);
  if ((int)y_00 < 0x1000001) {
    uVar18 = iVar5 * 0x10000;
    x_00 = uVar18 + uVar8;
    if ((int)x_00 < 0x1000001) {
      iVar5 = stbi__get16be(s);
      if ((iVar5 != 8) && (iVar5 != 0x10)) {
        pcVar13 = "unsupported bit depth";
        goto LAB_0010b953;
      }
      iVar9 = stbi__get16be(s);
      if (iVar9 != 3) {
        pcVar13 = "wrong color format";
        goto LAB_0010b953;
      }
      sVar10 = stbi__get32be(s);
      stbi__skip(s,sVar10);
      sVar10 = stbi__get32be(s);
      stbi__skip(s,sVar10);
      sVar10 = stbi__get32be(s);
      stbi__skip(s,sVar10);
      uVar11 = stbi__get16be(s);
      if (1 < uVar11) {
        pcVar13 = "bad compression";
        goto LAB_0010b953;
      }
      iVar9 = stbi__mad3sizes_valid(4,x_00,y_00,0);
      if (iVar9 != 0) {
        if (((bpc == 0x10) && (iVar5 == 0x10)) && (uVar11 == 0)) {
          data = (stbi__uint16 *)stbi__malloc_mad3(8,x_00,y_00,0);
          ri->bits_per_channel = 0x10;
        }
        else {
          data = (stbi__uint16 *)malloc((long)(int)(y_00 * x_00 * 4));
        }
        if (data != (stbi__uint16 *)0x0) {
          iVar9 = x_00 * y_00;
          uVar19 = (ulong)((uVar7 | uVar20) * (uVar8 | uVar18));
          if (uVar11 == 0) {
            lVar14 = uVar19 - 1;
            auVar25._8_4_ = (int)lVar14;
            auVar25._0_8_ = lVar14;
            auVar25._12_4_ = (int)((ulong)lVar14 >> 0x20);
            psVar21 = data + 0x1e;
            uVar11 = (uVar7 + uVar20) * (uVar8 + uVar18);
            psVar22 = data + 0x1c;
            uVar19 = 0;
            auVar102._8_4_ = 0xffffffff;
            auVar102._0_8_ = 0xffffffffffffffff;
            auVar102._12_4_ = 0xffffffff;
            auVar95 = _DAT_0011a1f0;
            local_80 = data;
            local_68 = data;
            do {
              if (uVar19 < uVar6) {
                if (ri->bits_per_channel == 0x10) {
                  if (0 < iVar9) {
                    lVar14 = 0;
                    do {
                      iVar12 = stbi__get16be(s);
                      auVar95 = _DAT_0011a1f0;
                      auVar102._8_4_ = 0xffffffff;
                      auVar102._0_8_ = 0xffffffffffffffff;
                      auVar102._12_4_ = 0xffffffff;
                      local_68[lVar14 * 4] = (stbi__uint16)iVar12;
                      lVar14 = lVar14 + 1;
                    } while (uVar11 != (uint)lVar14);
                  }
                }
                else if (iVar5 == 0x10) {
                  if (0 < iVar9) {
                    lVar14 = 0;
                    do {
                      iVar12 = stbi__get16be(s);
                      auVar95 = _DAT_0011a1f0;
                      auVar102._8_4_ = 0xffffffff;
                      auVar102._0_8_ = 0xffffffffffffffff;
                      auVar102._12_4_ = 0xffffffff;
                      *(char *)(local_80 + lVar14 * 2) = (char)((uint)iVar12 >> 8);
                      lVar14 = lVar14 + 1;
                    } while (uVar11 - (int)lVar14 != 0);
                  }
                }
                else if (0 < iVar9) {
                  psVar15 = s->img_buffer;
                  lVar14 = 0;
                  do {
                    if (psVar15 < s->img_buffer_end) {
LAB_0010c8c3:
                      s->img_buffer = psVar15 + 1;
                      sVar16 = *psVar15;
                      psVar15 = psVar15 + 1;
                    }
                    else {
                      if (s->read_from_callbacks != 0) {
                        stbi__refill_buffer(s);
                        auVar102._8_4_ = 0xffffffff;
                        auVar102._0_8_ = 0xffffffffffffffff;
                        auVar102._12_4_ = 0xffffffff;
                        psVar15 = s->img_buffer;
                        auVar95 = _DAT_0011a1f0;
                        goto LAB_0010c8c3;
                      }
                      sVar16 = '\0';
                    }
                    *(stbi_uc *)(local_80 + lVar14 * 2) = sVar16;
                    lVar14 = lVar14 + 1;
                  } while (uVar11 - (int)lVar14 != 0);
                }
              }
              else if (iVar5 == 0x10 && bpc == 0x10) {
                if (0 < iVar9) {
                  sVar4 = -(ushort)(uVar19 == 3);
                  uVar17 = 0;
                  do {
                    auVar26._8_4_ = (int)uVar17;
                    auVar26._0_8_ = uVar17;
                    auVar26._12_4_ = (int)(uVar17 >> 0x20);
                    auVar31 = auVar25 ^ auVar95;
                    auVar49 = (auVar26 | _DAT_0011a1e0) ^ auVar95;
                    iVar12 = auVar31._0_4_;
                    iVar93 = -(uint)(iVar12 < auVar49._0_4_);
                    iVar34 = auVar31._4_4_;
                    auVar51._4_4_ = -(uint)(iVar34 < auVar49._4_4_);
                    iVar35 = auVar31._8_4_;
                    iVar94 = -(uint)(iVar35 < auVar49._8_4_);
                    iVar85 = auVar31._12_4_;
                    auVar51._12_4_ = -(uint)(iVar85 < auVar49._12_4_);
                    auVar76._4_4_ = iVar93;
                    auVar76._0_4_ = iVar93;
                    auVar76._8_4_ = iVar94;
                    auVar76._12_4_ = iVar94;
                    auVar31 = pshuflw(in_XMM5,auVar76,0xe8);
                    auVar50._4_4_ = -(uint)(auVar49._4_4_ == iVar34);
                    auVar50._12_4_ = -(uint)(auVar49._12_4_ == iVar85);
                    auVar50._0_4_ = auVar50._4_4_;
                    auVar50._8_4_ = auVar50._12_4_;
                    auVar100 = pshuflw(in_XMM6,auVar50,0xe8);
                    auVar51._0_4_ = auVar51._4_4_;
                    auVar51._8_4_ = auVar51._12_4_;
                    auVar49 = pshuflw(auVar31,auVar51,0xe8);
                    auVar49 = (auVar49 | auVar100 & auVar31) ^ auVar102;
                    auVar49 = packssdw(auVar49,auVar49);
                    if ((auVar49 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      psVar22[uVar17 * 4 + -0x1c] = sVar4;
                    }
                    auVar51 = auVar50 & auVar76 | auVar51;
                    auVar49 = packssdw(auVar51,auVar51);
                    auVar49 = packssdw(auVar49 ^ auVar102,auVar49 ^ auVar102);
                    if ((auVar49._0_4_ >> 0x10 & 1) != 0) {
                      psVar22[uVar17 * 4 + -0x18] = sVar4;
                    }
                    auVar49 = (auVar26 | _DAT_0011a1d0) ^ auVar95;
                    iVar93 = -(uint)(iVar12 < auVar49._0_4_);
                    auVar90._4_4_ = -(uint)(iVar34 < auVar49._4_4_);
                    iVar94 = -(uint)(iVar35 < auVar49._8_4_);
                    auVar90._12_4_ = -(uint)(iVar85 < auVar49._12_4_);
                    auVar52._4_4_ = iVar93;
                    auVar52._0_4_ = iVar93;
                    auVar52._8_4_ = iVar94;
                    auVar52._12_4_ = iVar94;
                    auVar77._4_4_ = -(uint)(auVar49._4_4_ == iVar34);
                    auVar77._12_4_ = -(uint)(auVar49._12_4_ == iVar85);
                    auVar77._0_4_ = auVar77._4_4_;
                    auVar77._8_4_ = auVar77._12_4_;
                    auVar90._0_4_ = auVar90._4_4_;
                    auVar90._8_4_ = auVar90._12_4_;
                    auVar49 = auVar77 & auVar52 | auVar90;
                    auVar49 = packssdw(auVar49,auVar49);
                    auVar49 = packssdw(auVar49 ^ auVar102,auVar49 ^ auVar102);
                    if ((auVar49 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                      psVar22[uVar17 * 4 + -0x14] = sVar4;
                    }
                    auVar53 = pshufhw(auVar52,auVar52,0x84);
                    auVar29 = pshufhw(auVar77,auVar77,0x84);
                    auVar54 = pshufhw(auVar53,auVar90,0x84);
                    auVar53 = (auVar54 | auVar29 & auVar53) ^ auVar102;
                    auVar53 = packssdw(auVar53,auVar53);
                    if ((auVar53 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                      psVar22[uVar17 * 4 + -0x10] = sVar4;
                    }
                    auVar53 = (auVar26 | _DAT_0011a250) ^ auVar95;
                    iVar93 = -(uint)(iVar12 < auVar53._0_4_);
                    auVar56._4_4_ = -(uint)(iVar34 < auVar53._4_4_);
                    iVar94 = -(uint)(iVar35 < auVar53._8_4_);
                    auVar56._12_4_ = -(uint)(iVar85 < auVar53._12_4_);
                    auVar78._4_4_ = iVar93;
                    auVar78._0_4_ = iVar93;
                    auVar78._8_4_ = iVar94;
                    auVar78._12_4_ = iVar94;
                    auVar49 = pshuflw(auVar49,auVar78,0xe8);
                    auVar55._4_4_ = -(uint)(auVar53._4_4_ == iVar34);
                    auVar55._12_4_ = -(uint)(auVar53._12_4_ == iVar85);
                    auVar55._0_4_ = auVar55._4_4_;
                    auVar55._8_4_ = auVar55._12_4_;
                    in_XMM6 = pshuflw(auVar100 & auVar31,auVar55,0xe8);
                    in_XMM6 = in_XMM6 & auVar49;
                    auVar56._0_4_ = auVar56._4_4_;
                    auVar56._8_4_ = auVar56._12_4_;
                    auVar31 = pshuflw(auVar49,auVar56,0xe8);
                    auVar31 = (auVar31 | in_XMM6) ^ auVar102;
                    in_XMM5 = packssdw(auVar31,auVar31);
                    if ((in_XMM5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      psVar22[uVar17 * 4 + -0xc] = sVar4;
                    }
                    auVar56 = auVar55 & auVar78 | auVar56;
                    auVar31 = packssdw(auVar56,auVar56);
                    auVar31 = packssdw(auVar31 ^ auVar102,auVar31 ^ auVar102);
                    if ((auVar31 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                      psVar22[uVar17 * 4 + -8] = sVar4;
                    }
                    auVar31 = (auVar26 | _DAT_0011a240) ^ auVar95;
                    auVar79._0_4_ = -(uint)(iVar12 < auVar31._0_4_);
                    auVar79._4_4_ = -(uint)(iVar34 < auVar31._4_4_);
                    auVar79._8_4_ = -(uint)(iVar35 < auVar31._8_4_);
                    auVar79._12_4_ = -(uint)(iVar85 < auVar31._12_4_);
                    auVar57._4_4_ = auVar79._0_4_;
                    auVar57._0_4_ = auVar79._0_4_;
                    auVar57._8_4_ = auVar79._8_4_;
                    auVar57._12_4_ = auVar79._8_4_;
                    auVar27._4_4_ = -(uint)(auVar31._4_4_ == iVar34);
                    auVar27._12_4_ = -(uint)(auVar31._12_4_ == iVar85);
                    auVar27._0_4_ = auVar27._4_4_;
                    auVar27._8_4_ = auVar27._12_4_;
                    auVar32._4_4_ = auVar79._4_4_;
                    auVar32._0_4_ = auVar79._4_4_;
                    auVar32._8_4_ = auVar79._12_4_;
                    auVar32._12_4_ = auVar79._12_4_;
                    auVar31 = packssdw(auVar79,auVar27 & auVar57 | auVar32);
                    auVar31 = packssdw(auVar31 ^ auVar102,auVar31 ^ auVar102);
                    if ((auVar31 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                      psVar22[uVar17 * 4 + -4] = sVar4;
                    }
                    auVar100 = pshufhw(auVar57,auVar57,0x84);
                    auVar31 = pshufhw(auVar27,auVar27,0x84);
                    auVar49 = pshufhw(auVar32,auVar32,0x84);
                    auVar31 = packssdw(auVar31 & auVar100,(auVar49 | auVar31 & auVar100) ^ auVar102)
                    ;
                    if ((auVar31 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                      psVar22[uVar17 * 4] = sVar4;
                    }
                    uVar17 = uVar17 + 8;
                  } while (((ulong)uVar11 + 7 & 0xfffffffffffffff8) != uVar17);
                }
              }
              else if (0 < iVar9) {
                cVar3 = -(uVar19 == 3);
                uVar17 = 0;
                do {
                  auVar31._8_4_ = (int)uVar17;
                  auVar31._0_8_ = uVar17;
                  auVar31._12_4_ = (int)(uVar17 >> 0x20);
                  auVar49 = auVar25 ^ auVar95;
                  auVar100 = (auVar31 | _DAT_0011a1e0) ^ auVar95;
                  iVar12 = auVar49._0_4_;
                  iVar93 = -(uint)(iVar12 < auVar100._0_4_);
                  iVar34 = auVar49._4_4_;
                  auVar53._4_4_ = -(uint)(iVar34 < auVar100._4_4_);
                  iVar35 = auVar49._8_4_;
                  iVar94 = -(uint)(iVar35 < auVar100._8_4_);
                  iVar85 = auVar49._12_4_;
                  auVar53._12_4_ = -(uint)(iVar85 < auVar100._12_4_);
                  auVar54._4_4_ = iVar93;
                  auVar54._0_4_ = iVar93;
                  auVar54._8_4_ = iVar94;
                  auVar54._12_4_ = iVar94;
                  auVar29 = pshuflw(in_XMM5,auVar54,0xe8);
                  auVar49._4_4_ = -(uint)(auVar100._4_4_ == iVar34);
                  auVar49._12_4_ = -(uint)(auVar100._12_4_ == iVar85);
                  auVar49._0_4_ = auVar49._4_4_;
                  auVar49._8_4_ = auVar49._12_4_;
                  auVar36 = pshuflw(in_XMM6,auVar49,0xe8);
                  auVar53._0_4_ = auVar53._4_4_;
                  auVar53._8_4_ = auVar53._12_4_;
                  auVar100 = pshuflw(auVar29,auVar53,0xe8);
                  auVar100 = (auVar100 | auVar36 & auVar29) ^ auVar102;
                  auVar100 = packssdw(auVar100,auVar100);
                  if ((auVar100 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    *(char *)(psVar21 + uVar17 * 2 + -0x1e) = cVar3;
                  }
                  auVar53 = auVar49 & auVar54 | auVar53;
                  auVar49 = packssdw(auVar53,auVar53);
                  auVar49 = packssdw(auVar49 ^ auVar102,auVar49 ^ auVar102);
                  auVar49 = packsswb(auVar49,auVar49);
                  if ((auVar49._0_4_ >> 8 & 1) != 0) {
                    *(char *)(psVar21 + uVar17 * 2 + -0x1c) = cVar3;
                  }
                  auVar49 = (auVar31 | _DAT_0011a1d0) ^ auVar95;
                  iVar93 = -(uint)(iVar12 < auVar49._0_4_);
                  auVar69._4_4_ = -(uint)(iVar34 < auVar49._4_4_);
                  iVar94 = -(uint)(iVar35 < auVar49._8_4_);
                  auVar69._12_4_ = -(uint)(iVar85 < auVar49._12_4_);
                  auVar100._4_4_ = iVar93;
                  auVar100._0_4_ = iVar93;
                  auVar100._8_4_ = iVar94;
                  auVar100._12_4_ = iVar94;
                  auVar96._4_4_ = -(uint)(auVar49._4_4_ == iVar34);
                  auVar96._12_4_ = -(uint)(auVar49._12_4_ == iVar85);
                  auVar96._0_4_ = auVar96._4_4_;
                  auVar96._8_4_ = auVar96._12_4_;
                  auVar69._0_4_ = auVar69._4_4_;
                  auVar69._8_4_ = auVar69._12_4_;
                  auVar49 = auVar96 & auVar100 | auVar69;
                  auVar49 = packssdw(auVar49,auVar49);
                  auVar49 = packssdw(auVar49 ^ auVar102,auVar49 ^ auVar102);
                  auVar49 = packsswb(auVar49,auVar49);
                  if ((auVar49._0_4_ >> 0x10 & 1) != 0) {
                    *(char *)(psVar21 + uVar17 * 2 + -0x1a) = cVar3;
                  }
                  auVar100 = pshufhw(auVar100,auVar100,0x84);
                  auVar54 = pshufhw(auVar96,auVar96,0x84);
                  auVar53 = pshufhw(auVar100,auVar69,0x84);
                  auVar100 = (auVar53 | auVar54 & auVar100) ^ auVar102;
                  auVar100 = packssdw(auVar100,auVar100);
                  auVar100 = packsswb(auVar100,auVar100);
                  if ((auVar100._0_4_ >> 0x18 & 1) != 0) {
                    *(char *)(psVar21 + uVar17 * 2 + -0x18) = cVar3;
                  }
                  auVar100 = (auVar31 | _DAT_0011a250) ^ auVar95;
                  iVar93 = -(uint)(iVar12 < auVar100._0_4_);
                  auVar59._4_4_ = -(uint)(iVar34 < auVar100._4_4_);
                  iVar94 = -(uint)(iVar35 < auVar100._8_4_);
                  auVar59._12_4_ = -(uint)(iVar85 < auVar100._12_4_);
                  auVar80._4_4_ = iVar93;
                  auVar80._0_4_ = iVar93;
                  auVar80._8_4_ = iVar94;
                  auVar80._12_4_ = iVar94;
                  auVar49 = pshuflw(auVar49,auVar80,0xe8);
                  auVar58._4_4_ = -(uint)(auVar100._4_4_ == iVar34);
                  auVar58._12_4_ = -(uint)(auVar100._12_4_ == iVar85);
                  auVar58._0_4_ = auVar58._4_4_;
                  auVar58._8_4_ = auVar58._12_4_;
                  auVar53 = pshuflw(auVar36 & auVar29,auVar58,0xe8);
                  auVar59._0_4_ = auVar59._4_4_;
                  auVar59._8_4_ = auVar59._12_4_;
                  auVar100 = pshuflw(auVar49,auVar59,0xe8);
                  auVar100 = (auVar100 | auVar53 & auVar49) ^ auVar102;
                  auVar100 = packssdw(auVar100,auVar100);
                  auVar100 = packsswb(auVar100,auVar100);
                  if ((auVar100 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                    *(char *)(psVar21 + uVar17 * 2 + -0x16) = cVar3;
                  }
                  auVar59 = auVar58 & auVar80 | auVar59;
                  auVar100 = packssdw(auVar59,auVar59);
                  auVar100 = packssdw(auVar100 ^ auVar102,auVar100 ^ auVar102);
                  auVar100 = packsswb(auVar100,auVar100);
                  if ((auVar100._4_2_ >> 8 & 1) != 0) {
                    *(char *)(psVar21 + uVar17 * 2 + -0x14) = cVar3;
                  }
                  auVar100 = (auVar31 | _DAT_0011a240) ^ auVar95;
                  iVar93 = -(uint)(iVar12 < auVar100._0_4_);
                  auVar91._4_4_ = -(uint)(iVar34 < auVar100._4_4_);
                  iVar94 = -(uint)(iVar35 < auVar100._8_4_);
                  auVar91._12_4_ = -(uint)(iVar85 < auVar100._12_4_);
                  auVar29._4_4_ = iVar93;
                  auVar29._0_4_ = iVar93;
                  auVar29._8_4_ = iVar94;
                  auVar29._12_4_ = iVar94;
                  auVar36._4_4_ = -(uint)(auVar100._4_4_ == iVar34);
                  auVar36._12_4_ = -(uint)(auVar100._12_4_ == iVar85);
                  auVar36._0_4_ = auVar36._4_4_;
                  auVar36._8_4_ = auVar36._12_4_;
                  auVar91._0_4_ = auVar91._4_4_;
                  auVar91._8_4_ = auVar91._12_4_;
                  auVar100 = auVar36 & auVar29 | auVar91;
                  auVar100 = packssdw(auVar100,auVar100);
                  auVar100 = packssdw(auVar100 ^ auVar102,auVar100 ^ auVar102);
                  auVar100 = packsswb(auVar100,auVar100);
                  if ((auVar100 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                    *(char *)(psVar21 + uVar17 * 2 + -0x12) = cVar3;
                  }
                  auVar54 = pshufhw(auVar29,auVar29,0x84);
                  auVar36 = pshufhw(auVar36,auVar36,0x84);
                  auVar29 = pshufhw(auVar54,auVar91,0x84);
                  auVar54 = (auVar29 | auVar36 & auVar54) ^ auVar102;
                  auVar54 = packssdw(auVar54,auVar54);
                  auVar54 = packsswb(auVar54,auVar54);
                  if ((auVar54._6_2_ >> 8 & 1) != 0) {
                    *(char *)(psVar21 + uVar17 * 2 + -0x10) = cVar3;
                  }
                  auVar54 = (auVar31 | _DAT_0011a230) ^ auVar95;
                  iVar93 = -(uint)(iVar12 < auVar54._0_4_);
                  auVar61._4_4_ = -(uint)(iVar34 < auVar54._4_4_);
                  iVar94 = -(uint)(iVar35 < auVar54._8_4_);
                  auVar61._12_4_ = -(uint)(iVar85 < auVar54._12_4_);
                  auVar81._4_4_ = iVar93;
                  auVar81._0_4_ = iVar93;
                  auVar81._8_4_ = iVar94;
                  auVar81._12_4_ = iVar94;
                  auVar100 = pshuflw(auVar100,auVar81,0xe8);
                  auVar60._4_4_ = -(uint)(auVar54._4_4_ == iVar34);
                  auVar60._12_4_ = -(uint)(auVar54._12_4_ == iVar85);
                  auVar60._0_4_ = auVar60._4_4_;
                  auVar60._8_4_ = auVar60._12_4_;
                  auVar53 = pshuflw(auVar53 & auVar49,auVar60,0xe8);
                  auVar61._0_4_ = auVar61._4_4_;
                  auVar61._8_4_ = auVar61._12_4_;
                  auVar49 = pshuflw(auVar100,auVar61,0xe8);
                  auVar49 = (auVar49 | auVar53 & auVar100) ^ auVar102;
                  auVar49 = packssdw(auVar49,auVar49);
                  auVar49 = packsswb(auVar49,auVar49);
                  if ((auVar49 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    *(char *)(psVar21 + uVar17 * 2 + -0xe) = cVar3;
                  }
                  auVar61 = auVar60 & auVar81 | auVar61;
                  auVar49 = packssdw(auVar61,auVar61);
                  auVar49 = packssdw(auVar49 ^ auVar102,auVar49 ^ auVar102);
                  auVar49 = packsswb(auVar49,auVar49);
                  if ((auVar49._8_2_ >> 8 & 1) != 0) {
                    *(char *)(psVar21 + uVar17 * 2 + -0xc) = cVar3;
                  }
                  auVar49 = (auVar31 | _DAT_0011a220) ^ auVar95;
                  iVar93 = -(uint)(iVar12 < auVar49._0_4_);
                  auVar92._4_4_ = -(uint)(iVar34 < auVar49._4_4_);
                  iVar94 = -(uint)(iVar35 < auVar49._8_4_);
                  auVar92._12_4_ = -(uint)(iVar85 < auVar49._12_4_);
                  auVar62._4_4_ = iVar93;
                  auVar62._0_4_ = iVar93;
                  auVar62._8_4_ = iVar94;
                  auVar62._12_4_ = iVar94;
                  auVar82._4_4_ = -(uint)(auVar49._4_4_ == iVar34);
                  auVar82._12_4_ = -(uint)(auVar49._12_4_ == iVar85);
                  auVar82._0_4_ = auVar82._4_4_;
                  auVar82._8_4_ = auVar82._12_4_;
                  auVar92._0_4_ = auVar92._4_4_;
                  auVar92._8_4_ = auVar92._12_4_;
                  auVar49 = auVar82 & auVar62 | auVar92;
                  auVar49 = packssdw(auVar49,auVar49);
                  auVar49 = packssdw(auVar49 ^ auVar102,auVar49 ^ auVar102);
                  auVar49 = packsswb(auVar49,auVar49);
                  if ((auVar49 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                    *(char *)(psVar21 + uVar17 * 2 + -10) = cVar3;
                  }
                  auVar54 = pshufhw(auVar62,auVar62,0x84);
                  auVar36 = pshufhw(auVar82,auVar82,0x84);
                  auVar29 = pshufhw(auVar54,auVar92,0x84);
                  auVar54 = (auVar29 | auVar36 & auVar54) ^ auVar102;
                  auVar54 = packssdw(auVar54,auVar54);
                  auVar54 = packsswb(auVar54,auVar54);
                  if ((auVar54._10_2_ >> 8 & 1) != 0) {
                    *(char *)(psVar21 + uVar17 * 2 + -8) = cVar3;
                  }
                  auVar54 = (auVar31 | _DAT_0011a210) ^ auVar95;
                  iVar93 = -(uint)(iVar12 < auVar54._0_4_);
                  auVar64._4_4_ = -(uint)(iVar34 < auVar54._4_4_);
                  iVar94 = -(uint)(iVar35 < auVar54._8_4_);
                  auVar64._12_4_ = -(uint)(iVar85 < auVar54._12_4_);
                  auVar83._4_4_ = iVar93;
                  auVar83._0_4_ = iVar93;
                  auVar83._8_4_ = iVar94;
                  auVar83._12_4_ = iVar94;
                  auVar49 = pshuflw(auVar49,auVar83,0xe8);
                  auVar63._4_4_ = -(uint)(auVar54._4_4_ == iVar34);
                  auVar63._12_4_ = -(uint)(auVar54._12_4_ == iVar85);
                  auVar63._0_4_ = auVar63._4_4_;
                  auVar63._8_4_ = auVar63._12_4_;
                  in_XMM6 = pshuflw(auVar53 & auVar100,auVar63,0xe8);
                  in_XMM6 = in_XMM6 & auVar49;
                  auVar64._0_4_ = auVar64._4_4_;
                  auVar64._8_4_ = auVar64._12_4_;
                  auVar49 = pshuflw(auVar49,auVar64,0xe8);
                  auVar49 = (auVar49 | in_XMM6) ^ auVar102;
                  auVar49 = packssdw(auVar49,auVar49);
                  in_XMM5 = packsswb(auVar49,auVar49);
                  if ((in_XMM5 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                    *(char *)(psVar21 + uVar17 * 2 + -6) = cVar3;
                  }
                  auVar64 = auVar63 & auVar83 | auVar64;
                  auVar49 = packssdw(auVar64,auVar64);
                  auVar49 = packssdw(auVar49 ^ auVar102,auVar49 ^ auVar102);
                  auVar49 = packsswb(auVar49,auVar49);
                  if ((auVar49._12_2_ >> 8 & 1) != 0) {
                    *(char *)(psVar21 + uVar17 * 2 + -4) = cVar3;
                  }
                  auVar31 = (auVar31 | _DAT_0011a200) ^ auVar95;
                  auVar84._0_4_ = -(uint)(iVar12 < auVar31._0_4_);
                  auVar84._4_4_ = -(uint)(iVar34 < auVar31._4_4_);
                  auVar84._8_4_ = -(uint)(iVar35 < auVar31._8_4_);
                  auVar84._12_4_ = -(uint)(iVar85 < auVar31._12_4_);
                  auVar65._4_4_ = auVar84._0_4_;
                  auVar65._0_4_ = auVar84._0_4_;
                  auVar65._8_4_ = auVar84._8_4_;
                  auVar65._12_4_ = auVar84._8_4_;
                  auVar28._4_4_ = -(uint)(auVar31._4_4_ == iVar34);
                  auVar28._12_4_ = -(uint)(auVar31._12_4_ == iVar85);
                  auVar28._0_4_ = auVar28._4_4_;
                  auVar28._8_4_ = auVar28._12_4_;
                  auVar33._4_4_ = auVar84._4_4_;
                  auVar33._0_4_ = auVar84._4_4_;
                  auVar33._8_4_ = auVar84._12_4_;
                  auVar33._12_4_ = auVar84._12_4_;
                  auVar31 = packssdw(auVar84,auVar28 & auVar65 | auVar33);
                  auVar31 = packssdw(auVar31 ^ auVar102,auVar31 ^ auVar102);
                  auVar31 = packsswb(auVar31,auVar31);
                  if ((auVar31 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                    *(char *)(psVar21 + uVar17 * 2 + -2) = cVar3;
                  }
                  auVar100 = pshufhw(auVar65,auVar65,0x84);
                  auVar31 = pshufhw(auVar28,auVar28,0x84);
                  auVar49 = pshufhw(auVar33,auVar33,0x84);
                  auVar31 = packssdw(auVar31 & auVar100,(auVar49 | auVar31 & auVar100) ^ auVar102);
                  auVar31 = packsswb(auVar31,auVar31);
                  if ((auVar31._14_2_ >> 8 & 1) != 0) {
                    *(char *)(psVar21 + uVar17 * 2) = cVar3;
                  }
                  uVar17 = uVar17 + 0x10;
                } while (((ulong)uVar11 + 0xf & 0xfffffffffffffff0) != uVar17);
              }
              uVar19 = uVar19 + 1;
              psVar21 = (stbi__uint16 *)((long)psVar21 + 1);
              psVar22 = psVar22 + 1;
              local_80 = (stbi__uint16 *)((long)local_80 + 1);
              local_68 = local_68 + 1;
            } while (uVar19 != 4);
          }
          else {
            stbi__skip(s,uVar6 * y_00 * 2);
            lVar14 = uVar19 - 1;
            auVar101._8_4_ = (int)lVar14;
            auVar101._0_8_ = lVar14;
            auVar101._12_4_ = (int)((ulong)lVar14 >> 0x20);
            psVar21 = data + 0x1e;
            uVar19 = 0;
            auVar95 = _DAT_0011a200;
            auVar25 = _DAT_0011a210;
            auVar102 = _DAT_0011a220;
            auVar31 = _DAT_0011a230;
            auVar49 = _DAT_0011a240;
            auVar100 = _DAT_0011a250;
            auVar53 = _DAT_0011a1d0;
            auVar54 = _DAT_0011a1e0;
            do {
              if (uVar19 < uVar6) {
                iVar5 = stbi__psd_decode_rle(s,(stbi_uc *)(uVar19 + (long)data),iVar9);
                auVar95 = _DAT_0011a200;
                auVar25 = _DAT_0011a210;
                auVar102 = _DAT_0011a220;
                auVar31 = _DAT_0011a230;
                auVar49 = _DAT_0011a240;
                auVar100 = _DAT_0011a250;
                auVar53 = _DAT_0011a1d0;
                auVar54 = _DAT_0011a1e0;
                if (iVar5 == 0) {
                  free(data);
                  pcVar13 = "corrupt";
                  goto LAB_0010b953;
                }
              }
              else if (0 < iVar9) {
                cVar3 = -(uVar19 == 3);
                uVar17 = 0;
                do {
                  auVar23._8_4_ = (int)uVar17;
                  auVar23._0_8_ = uVar17;
                  auVar23._12_4_ = (int)(uVar17 >> 0x20);
                  auVar29 = auVar101 ^ _DAT_0011a1f0;
                  auVar36 = (auVar23 | auVar54) ^ _DAT_0011a1f0;
                  iVar5 = auVar29._0_4_;
                  iVar85 = -(uint)(iVar5 < auVar36._0_4_);
                  iVar12 = auVar29._4_4_;
                  auVar38._4_4_ = -(uint)(iVar12 < auVar36._4_4_);
                  iVar34 = auVar29._8_4_;
                  iVar93 = -(uint)(iVar34 < auVar36._8_4_);
                  iVar35 = auVar29._12_4_;
                  auVar38._12_4_ = -(uint)(iVar35 < auVar36._12_4_);
                  auVar67._4_4_ = iVar85;
                  auVar67._0_4_ = iVar85;
                  auVar67._8_4_ = iVar93;
                  auVar67._12_4_ = iVar93;
                  auVar29 = pshuflw(in_XMM5,auVar67,0xe8);
                  auVar37._4_4_ = -(uint)(auVar36._4_4_ == iVar12);
                  auVar37._12_4_ = -(uint)(auVar36._12_4_ == iVar35);
                  auVar37._0_4_ = auVar37._4_4_;
                  auVar37._8_4_ = auVar37._12_4_;
                  auVar96 = pshuflw(in_XMM6,auVar37,0xe8);
                  auVar38._0_4_ = auVar38._4_4_;
                  auVar38._8_4_ = auVar38._12_4_;
                  auVar36 = pshuflw(auVar29,auVar38,0xe8);
                  auVar97._8_4_ = 0xffffffff;
                  auVar97._0_8_ = 0xffffffffffffffff;
                  auVar97._12_4_ = 0xffffffff;
                  auVar29 = (auVar36 | auVar96 & auVar29) ^ auVar97;
                  auVar29 = packssdw(auVar29,auVar29);
                  if ((auVar29 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    *(char *)(psVar21 + uVar17 * 2 + -0x1e) = cVar3;
                  }
                  auVar38 = auVar37 & auVar67 | auVar38;
                  auVar29 = packssdw(auVar38,auVar38);
                  auVar29 = packssdw(auVar29 ^ auVar97,auVar29 ^ auVar97);
                  auVar29 = packsswb(auVar29,auVar29);
                  if ((auVar29._0_4_ >> 8 & 1) != 0) {
                    *(char *)(psVar21 + uVar17 * 2 + -0x1c) = cVar3;
                  }
                  auVar29 = (auVar23 | auVar53) ^ _DAT_0011a1f0;
                  iVar85 = -(uint)(iVar5 < auVar29._0_4_);
                  auVar87._4_4_ = -(uint)(iVar12 < auVar29._4_4_);
                  iVar93 = -(uint)(iVar34 < auVar29._8_4_);
                  auVar87._12_4_ = -(uint)(iVar35 < auVar29._12_4_);
                  auVar39._4_4_ = iVar85;
                  auVar39._0_4_ = iVar85;
                  auVar39._8_4_ = iVar93;
                  auVar39._12_4_ = iVar93;
                  auVar68._4_4_ = -(uint)(auVar29._4_4_ == iVar12);
                  auVar68._12_4_ = -(uint)(auVar29._12_4_ == iVar35);
                  auVar68._0_4_ = auVar68._4_4_;
                  auVar68._8_4_ = auVar68._12_4_;
                  auVar87._0_4_ = auVar87._4_4_;
                  auVar87._8_4_ = auVar87._12_4_;
                  auVar29 = auVar68 & auVar39 | auVar87;
                  auVar29 = packssdw(auVar29,auVar29);
                  auVar29 = packssdw(auVar29 ^ auVar97,auVar29 ^ auVar97);
                  auVar29 = packsswb(auVar29,auVar29);
                  if ((auVar29._0_4_ >> 0x10 & 1) != 0) {
                    *(char *)(psVar21 + uVar17 * 2 + -0x1a) = cVar3;
                  }
                  auVar36 = pshufhw(auVar39,auVar39,0x84);
                  auVar69 = pshufhw(auVar68,auVar68,0x84);
                  auVar96 = pshufhw(auVar36,auVar87,0x84);
                  auVar36 = (auVar96 | auVar69 & auVar36) ^ auVar97;
                  auVar36 = packssdw(auVar36,auVar36);
                  auVar36 = packsswb(auVar36,auVar36);
                  if ((auVar36._0_4_ >> 0x18 & 1) != 0) {
                    *(char *)(psVar21 + uVar17 * 2 + -0x18) = cVar3;
                  }
                  auVar36 = (auVar23 | auVar100) ^ _DAT_0011a1f0;
                  iVar85 = -(uint)(iVar5 < auVar36._0_4_);
                  auVar41._4_4_ = -(uint)(iVar12 < auVar36._4_4_);
                  iVar93 = -(uint)(iVar34 < auVar36._8_4_);
                  auVar41._12_4_ = -(uint)(iVar35 < auVar36._12_4_);
                  auVar70._4_4_ = iVar85;
                  auVar70._0_4_ = iVar85;
                  auVar70._8_4_ = iVar93;
                  auVar70._12_4_ = iVar93;
                  auVar29 = pshuflw(auVar29,auVar70,0xe8);
                  auVar40._4_4_ = -(uint)(auVar36._4_4_ == iVar12);
                  auVar40._12_4_ = -(uint)(auVar36._12_4_ == iVar35);
                  auVar40._0_4_ = auVar40._4_4_;
                  auVar40._8_4_ = auVar40._12_4_;
                  auVar96 = pshuflw(auVar97,auVar40,0xe8);
                  auVar41._0_4_ = auVar41._4_4_;
                  auVar41._8_4_ = auVar41._12_4_;
                  auVar36 = pshuflw(auVar29,auVar41,0xe8);
                  auVar98._8_4_ = 0xffffffff;
                  auVar98._0_8_ = 0xffffffffffffffff;
                  auVar98._12_4_ = 0xffffffff;
                  auVar29 = (auVar36 | auVar96 & auVar29) ^ auVar98;
                  auVar29 = packssdw(auVar29,auVar29);
                  auVar29 = packsswb(auVar29,auVar29);
                  if ((auVar29 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                    *(char *)(psVar21 + uVar17 * 2 + -0x16) = cVar3;
                  }
                  auVar41 = auVar40 & auVar70 | auVar41;
                  auVar29 = packssdw(auVar41,auVar41);
                  auVar29 = packssdw(auVar29 ^ auVar98,auVar29 ^ auVar98);
                  auVar29 = packsswb(auVar29,auVar29);
                  if ((auVar29._4_2_ >> 8 & 1) != 0) {
                    *(char *)(psVar21 + uVar17 * 2 + -0x14) = cVar3;
                  }
                  auVar29 = (auVar23 | auVar49) ^ _DAT_0011a1f0;
                  iVar85 = -(uint)(iVar5 < auVar29._0_4_);
                  auVar88._4_4_ = -(uint)(iVar12 < auVar29._4_4_);
                  iVar93 = -(uint)(iVar34 < auVar29._8_4_);
                  auVar88._12_4_ = -(uint)(iVar35 < auVar29._12_4_);
                  auVar42._4_4_ = iVar85;
                  auVar42._0_4_ = iVar85;
                  auVar42._8_4_ = iVar93;
                  auVar42._12_4_ = iVar93;
                  auVar71._4_4_ = -(uint)(auVar29._4_4_ == iVar12);
                  auVar71._12_4_ = -(uint)(auVar29._12_4_ == iVar35);
                  auVar71._0_4_ = auVar71._4_4_;
                  auVar71._8_4_ = auVar71._12_4_;
                  auVar88._0_4_ = auVar88._4_4_;
                  auVar88._8_4_ = auVar88._12_4_;
                  auVar29 = auVar71 & auVar42 | auVar88;
                  auVar29 = packssdw(auVar29,auVar29);
                  auVar29 = packssdw(auVar29 ^ auVar98,auVar29 ^ auVar98);
                  auVar29 = packsswb(auVar29,auVar29);
                  if ((auVar29 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                    *(char *)(psVar21 + uVar17 * 2 + -0x12) = cVar3;
                  }
                  auVar36 = pshufhw(auVar42,auVar42,0x84);
                  auVar69 = pshufhw(auVar71,auVar71,0x84);
                  auVar96 = pshufhw(auVar36,auVar88,0x84);
                  auVar36 = (auVar96 | auVar69 & auVar36) ^ auVar98;
                  auVar36 = packssdw(auVar36,auVar36);
                  auVar36 = packsswb(auVar36,auVar36);
                  if ((auVar36._6_2_ >> 8 & 1) != 0) {
                    *(char *)(psVar21 + uVar17 * 2 + -0x10) = cVar3;
                  }
                  auVar36 = (auVar23 | auVar31) ^ _DAT_0011a1f0;
                  iVar85 = -(uint)(iVar5 < auVar36._0_4_);
                  auVar44._4_4_ = -(uint)(iVar12 < auVar36._4_4_);
                  iVar93 = -(uint)(iVar34 < auVar36._8_4_);
                  auVar44._12_4_ = -(uint)(iVar35 < auVar36._12_4_);
                  auVar72._4_4_ = iVar85;
                  auVar72._0_4_ = iVar85;
                  auVar72._8_4_ = iVar93;
                  auVar72._12_4_ = iVar93;
                  auVar29 = pshuflw(auVar29,auVar72,0xe8);
                  auVar43._4_4_ = -(uint)(auVar36._4_4_ == iVar12);
                  auVar43._12_4_ = -(uint)(auVar36._12_4_ == iVar35);
                  auVar43._0_4_ = auVar43._4_4_;
                  auVar43._8_4_ = auVar43._12_4_;
                  auVar96 = pshuflw(auVar98,auVar43,0xe8);
                  auVar44._0_4_ = auVar44._4_4_;
                  auVar44._8_4_ = auVar44._12_4_;
                  auVar36 = pshuflw(auVar29,auVar44,0xe8);
                  auVar99._8_4_ = 0xffffffff;
                  auVar99._0_8_ = 0xffffffffffffffff;
                  auVar99._12_4_ = 0xffffffff;
                  auVar29 = (auVar36 | auVar96 & auVar29) ^ auVar99;
                  auVar29 = packssdw(auVar29,auVar29);
                  auVar29 = packsswb(auVar29,auVar29);
                  if ((auVar29 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    *(char *)(psVar21 + uVar17 * 2 + -0xe) = cVar3;
                  }
                  auVar44 = auVar43 & auVar72 | auVar44;
                  auVar29 = packssdw(auVar44,auVar44);
                  auVar29 = packssdw(auVar29 ^ auVar99,auVar29 ^ auVar99);
                  auVar29 = packsswb(auVar29,auVar29);
                  if ((auVar29._8_2_ >> 8 & 1) != 0) {
                    *(char *)(psVar21 + uVar17 * 2 + -0xc) = cVar3;
                  }
                  auVar29 = (auVar23 | auVar102) ^ _DAT_0011a1f0;
                  iVar85 = -(uint)(iVar5 < auVar29._0_4_);
                  auVar89._4_4_ = -(uint)(iVar12 < auVar29._4_4_);
                  iVar93 = -(uint)(iVar34 < auVar29._8_4_);
                  auVar89._12_4_ = -(uint)(iVar35 < auVar29._12_4_);
                  auVar45._4_4_ = iVar85;
                  auVar45._0_4_ = iVar85;
                  auVar45._8_4_ = iVar93;
                  auVar45._12_4_ = iVar93;
                  auVar73._4_4_ = -(uint)(auVar29._4_4_ == iVar12);
                  auVar73._12_4_ = -(uint)(auVar29._12_4_ == iVar35);
                  auVar73._0_4_ = auVar73._4_4_;
                  auVar73._8_4_ = auVar73._12_4_;
                  auVar89._0_4_ = auVar89._4_4_;
                  auVar89._8_4_ = auVar89._12_4_;
                  auVar29 = auVar73 & auVar45 | auVar89;
                  auVar29 = packssdw(auVar29,auVar29);
                  auVar29 = packssdw(auVar29 ^ auVar99,auVar29 ^ auVar99);
                  auVar29 = packsswb(auVar29,auVar29);
                  if ((auVar29 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                    *(char *)(psVar21 + uVar17 * 2 + -10) = cVar3;
                  }
                  auVar36 = pshufhw(auVar45,auVar45,0x84);
                  auVar69 = pshufhw(auVar73,auVar73,0x84);
                  auVar96 = pshufhw(auVar36,auVar89,0x84);
                  auVar36 = (auVar96 | auVar69 & auVar36) ^ auVar99;
                  auVar36 = packssdw(auVar36,auVar36);
                  auVar36 = packsswb(auVar36,auVar36);
                  if ((auVar36._10_2_ >> 8 & 1) != 0) {
                    *(char *)(psVar21 + uVar17 * 2 + -8) = cVar3;
                  }
                  auVar36 = (auVar23 | auVar25) ^ _DAT_0011a1f0;
                  iVar85 = -(uint)(iVar5 < auVar36._0_4_);
                  auVar47._4_4_ = -(uint)(iVar12 < auVar36._4_4_);
                  iVar93 = -(uint)(iVar34 < auVar36._8_4_);
                  auVar47._12_4_ = -(uint)(iVar35 < auVar36._12_4_);
                  auVar74._4_4_ = iVar85;
                  auVar74._0_4_ = iVar85;
                  auVar74._8_4_ = iVar93;
                  auVar74._12_4_ = iVar93;
                  auVar29 = pshuflw(auVar29,auVar74,0xe8);
                  auVar46._4_4_ = -(uint)(auVar36._4_4_ == iVar12);
                  auVar46._12_4_ = -(uint)(auVar36._12_4_ == iVar35);
                  auVar46._0_4_ = auVar46._4_4_;
                  auVar46._8_4_ = auVar46._12_4_;
                  auVar96 = pshuflw(auVar99,auVar46,0xe8);
                  auVar47._0_4_ = auVar47._4_4_;
                  auVar47._8_4_ = auVar47._12_4_;
                  auVar36 = pshuflw(auVar29,auVar47,0xe8);
                  in_XMM6._8_4_ = 0xffffffff;
                  in_XMM6._0_8_ = 0xffffffffffffffff;
                  in_XMM6._12_4_ = 0xffffffff;
                  auVar29 = (auVar36 | auVar96 & auVar29) ^ in_XMM6;
                  auVar29 = packssdw(auVar29,auVar29);
                  in_XMM5 = packsswb(auVar29,auVar29);
                  if ((in_XMM5 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                    *(char *)(psVar21 + uVar17 * 2 + -6) = cVar3;
                  }
                  auVar47 = auVar46 & auVar74 | auVar47;
                  auVar29 = packssdw(auVar47,auVar47);
                  auVar29 = packssdw(auVar29 ^ in_XMM6,auVar29 ^ in_XMM6);
                  auVar29 = packsswb(auVar29,auVar29);
                  if ((auVar29._12_2_ >> 8 & 1) != 0) {
                    *(char *)(psVar21 + uVar17 * 2 + -4) = cVar3;
                  }
                  auVar29 = (auVar23 | auVar95) ^ _DAT_0011a1f0;
                  auVar75._0_4_ = -(uint)(iVar5 < auVar29._0_4_);
                  auVar75._4_4_ = -(uint)(iVar12 < auVar29._4_4_);
                  auVar75._8_4_ = -(uint)(iVar34 < auVar29._8_4_);
                  auVar75._12_4_ = -(uint)(iVar35 < auVar29._12_4_);
                  auVar48._4_4_ = auVar75._0_4_;
                  auVar48._0_4_ = auVar75._0_4_;
                  auVar48._8_4_ = auVar75._8_4_;
                  auVar48._12_4_ = auVar75._8_4_;
                  auVar24._4_4_ = -(uint)(auVar29._4_4_ == iVar12);
                  auVar24._12_4_ = -(uint)(auVar29._12_4_ == iVar35);
                  auVar24._0_4_ = auVar24._4_4_;
                  auVar24._8_4_ = auVar24._12_4_;
                  auVar30._4_4_ = auVar75._4_4_;
                  auVar30._0_4_ = auVar75._4_4_;
                  auVar30._8_4_ = auVar75._12_4_;
                  auVar30._12_4_ = auVar75._12_4_;
                  auVar29 = packssdw(auVar75,auVar24 & auVar48 | auVar30);
                  auVar29 = packssdw(auVar29 ^ in_XMM6,auVar29 ^ in_XMM6);
                  auVar29 = packsswb(auVar29,auVar29);
                  if ((auVar29 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                    *(char *)(psVar21 + uVar17 * 2 + -2) = cVar3;
                  }
                  auVar96 = pshufhw(auVar48,auVar48,0x84);
                  auVar29 = pshufhw(auVar24,auVar24,0x84);
                  auVar36 = pshufhw(auVar30,auVar30,0x84);
                  auVar29 = packssdw(auVar29 & auVar96,(auVar36 | auVar29 & auVar96) ^ in_XMM6);
                  auVar29 = packsswb(auVar29,auVar29);
                  if ((auVar29._14_2_ >> 8 & 1) != 0) {
                    *(char *)(psVar21 + uVar17 * 2) = cVar3;
                  }
                  uVar17 = uVar17 + 0x10;
                } while (((ulong)((uVar7 + uVar20) * (uVar8 + uVar18)) + 0xf & 0xfffffffffffffff0)
                         != uVar17);
              }
              uVar19 = uVar19 + 1;
              psVar21 = (stbi__uint16 *)((long)psVar21 + 1);
            } while (uVar19 != 4);
          }
          if (3 < uVar6) {
            if (ri->bits_per_channel == 0x10) {
              if (0 < iVar9) {
                uVar19 = 0;
                do {
                  uVar2 = data[uVar19 * 4 + 3];
                  if ((uVar2 != 0) && (uVar2 != 0xffff)) {
                    fVar86 = 1.0 / ((float)uVar2 / 65535.0);
                    fVar66 = (1.0 - fVar86) * 65535.0;
                    auVar95._0_4_ =
                         (int)(fVar66 + fVar86 * (float)(*(uint *)(data + uVar19 * 4) & 0xffff));
                    auVar95._4_4_ =
                         (int)(fVar66 + fVar86 * (float)(*(uint *)(data + uVar19 * 4) >> 0x10));
                    auVar95._8_4_ = (int)(fVar66 + fVar86 * 0.0);
                    auVar95._12_4_ = (int)(fVar66 + fVar86 * 0.0);
                    auVar95 = pshuflw(auVar95,auVar95,0xe8);
                    *(int *)(data + uVar19 * 4) = auVar95._0_4_;
                    data[uVar19 * 4 + 2] =
                         (stbi__uint16)(int)((float)data[uVar19 * 4 + 2] * fVar86 + fVar66);
                  }
                  uVar19 = uVar19 + 1;
                } while ((uVar7 + uVar20) * (uVar8 + uVar18) != uVar19);
              }
            }
            else if (0 < iVar9) {
              uVar19 = 0;
              do {
                bVar1 = *(byte *)((long)data + uVar19 * 4 + 3);
                if ((bVar1 != 0) && (bVar1 != 0xff)) {
                  fVar86 = 1.0 / ((float)bVar1 / 255.0);
                  fVar66 = (1.0 - fVar86) * 255.0;
                  *(char *)(data + uVar19 * 2) =
                       (char)(int)((float)(byte)data[uVar19 * 2] * fVar86 + fVar66);
                  *(char *)((long)data + uVar19 * 4 + 1) =
                       (char)(int)((float)*(byte *)((long)data + uVar19 * 4 + 1) * fVar86 + fVar66);
                  *(char *)(data + uVar19 * 2 + 1) =
                       (char)(int)((float)(byte)data[uVar19 * 2 + 1] * fVar86 + fVar66);
                }
                uVar19 = uVar19 + 1;
              } while ((uVar7 + uVar20) * (uVar8 + uVar18) != uVar19);
            }
          }
          if ((req_comp & 0xfffffffbU) != 0) {
            if (ri->bits_per_channel == 0x10) {
              data = stbi__convert_format16(data,4,req_comp,x_00,y_00);
            }
            else {
              data = (stbi__uint16 *)stbi__convert_format((uchar *)data,4,req_comp,x_00,y_00);
            }
            if (data == (stbi__uint16 *)0x0) {
              return (void *)0x0;
            }
          }
          if (comp != (int *)0x0) {
            *comp = 4;
          }
          *y = y_00;
          *x = x_00;
          return data;
        }
        pcVar13 = "outofmem";
        goto LAB_0010b953;
      }
    }
  }
  pcVar13 = "too large";
LAB_0010b953:
  *(char **)(in_FS_OFFSET + -0x10) = pcVar13;
  return (void *)0x0;
}

Assistant:

static void *stbi__psd_load(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri, int bpc)
{
   int pixelCount;
   int channelCount, compression;
   int channel, i;
   int bitdepth;
   int w,h;
   stbi_uc *out;
   STBI_NOTUSED(ri);

   // Check identifier
   if (stbi__get32be(s) != 0x38425053)   // "8BPS"
      return stbi__errpuc("not PSD", "Corrupt PSD image");

   // Check file type version.
   if (stbi__get16be(s) != 1)
      return stbi__errpuc("wrong version", "Unsupported version of PSD image");

   // Skip 6 reserved bytes.
   stbi__skip(s, 6 );

   // Read the number of channels (R, G, B, A, etc).
   channelCount = stbi__get16be(s);
   if (channelCount < 0 || channelCount > 16)
      return stbi__errpuc("wrong channel count", "Unsupported number of channels in PSD image");

   // Read the rows and columns of the image.
   h = stbi__get32be(s);
   w = stbi__get32be(s);

   if (h > STBI_MAX_DIMENSIONS) return stbi__errpuc("too large","Very large image (corrupt?)");
   if (w > STBI_MAX_DIMENSIONS) return stbi__errpuc("too large","Very large image (corrupt?)");

   // Make sure the depth is 8 bits.
   bitdepth = stbi__get16be(s);
   if (bitdepth != 8 && bitdepth != 16)
      return stbi__errpuc("unsupported bit depth", "PSD bit depth is not 8 or 16 bit");

   // Make sure the color mode is RGB.
   // Valid options are:
   //   0: Bitmap
   //   1: Grayscale
   //   2: Indexed color
   //   3: RGB color
   //   4: CMYK color
   //   7: Multichannel
   //   8: Duotone
   //   9: Lab color
   if (stbi__get16be(s) != 3)
      return stbi__errpuc("wrong color format", "PSD is not in RGB color format");

   // Skip the Mode Data.  (It's the palette for indexed color; other info for other modes.)
   stbi__skip(s,stbi__get32be(s) );

   // Skip the image resources.  (resolution, pen tool paths, etc)
   stbi__skip(s, stbi__get32be(s) );

   // Skip the reserved data.
   stbi__skip(s, stbi__get32be(s) );

   // Find out if the data is compressed.
   // Known values:
   //   0: no compression
   //   1: RLE compressed
   compression = stbi__get16be(s);
   if (compression > 1)
      return stbi__errpuc("bad compression", "PSD has an unknown compression format");

   // Check size
   if (!stbi__mad3sizes_valid(4, w, h, 0))
      return stbi__errpuc("too large", "Corrupt PSD");

   // Create the destination image.

   if (!compression && bitdepth == 16 && bpc == 16) {
      out = (stbi_uc *) stbi__malloc_mad3(8, w, h, 0);
      ri->bits_per_channel = 16;
   } else
      out = (stbi_uc *) stbi__malloc(4 * w*h);

   if (!out) return stbi__errpuc("outofmem", "Out of memory");
   pixelCount = w*h;

   // Initialize the data to zero.
   //memset( out, 0, pixelCount * 4 );

   // Finally, the image data.
   if (compression) {
      // RLE as used by .PSD and .TIFF
      // Loop until you get the number of unpacked bytes you are expecting:
      //     Read the next source byte into n.
      //     If n is between 0 and 127 inclusive, copy the next n+1 bytes literally.
      //     Else if n is between -127 and -1 inclusive, copy the next byte -n+1 times.
      //     Else if n is 128, noop.
      // Endloop

      // The RLE-compressed data is preceded by a 2-byte data count for each row in the data,
      // which we're going to just skip.
      stbi__skip(s, h * channelCount * 2 );

      // Read the RLE data by channel.
      for (channel = 0; channel < 4; channel++) {
         stbi_uc *p;

         p = out+channel;
         if (channel >= channelCount) {
            // Fill this channel with default data.
            for (i = 0; i < pixelCount; i++, p += 4)
               *p = (channel == 3 ? 255 : 0);
         } else {
            // Read the RLE data.
            if (!stbi__psd_decode_rle(s, p, pixelCount)) {
               STBI_FREE(out);
               return stbi__errpuc("corrupt", "bad RLE data");
            }
         }
      }

   } else {
      // We're at the raw image data.  It's each channel in order (Red, Green, Blue, Alpha, ...)
      // where each channel consists of an 8-bit (or 16-bit) value for each pixel in the image.

      // Read the data by channel.
      for (channel = 0; channel < 4; channel++) {
         if (channel >= channelCount) {
            // Fill this channel with default data.
            if (bitdepth == 16 && bpc == 16) {
               stbi__uint16 *q = ((stbi__uint16 *) out) + channel;
               stbi__uint16 val = channel == 3 ? 65535 : 0;
               for (i = 0; i < pixelCount; i++, q += 4)
                  *q = val;
            } else {
               stbi_uc *p = out+channel;
               stbi_uc val = channel == 3 ? 255 : 0;
               for (i = 0; i < pixelCount; i++, p += 4)
                  *p = val;
            }
         } else {
            if (ri->bits_per_channel == 16) {    // output bpc
               stbi__uint16 *q = ((stbi__uint16 *) out) + channel;
               for (i = 0; i < pixelCount; i++, q += 4)
                  *q = (stbi__uint16) stbi__get16be(s);
            } else {
               stbi_uc *p = out+channel;
               if (bitdepth == 16) {  // input bpc
                  for (i = 0; i < pixelCount; i++, p += 4)
                     *p = (stbi_uc) (stbi__get16be(s) >> 8);
               } else {
                  for (i = 0; i < pixelCount; i++, p += 4)
                     *p = stbi__get8(s);
               }
            }
         }
      }
   }

   // remove weird white matte from PSD
   if (channelCount >= 4) {
      if (ri->bits_per_channel == 16) {
         for (i=0; i < w*h; ++i) {
            stbi__uint16 *pixel = (stbi__uint16 *) out + 4*i;
            if (pixel[3] != 0 && pixel[3] != 65535) {
               float a = pixel[3] / 65535.0f;
               float ra = 1.0f / a;
               float inv_a = 65535.0f * (1 - ra);
               pixel[0] = (stbi__uint16) (pixel[0]*ra + inv_a);
               pixel[1] = (stbi__uint16) (pixel[1]*ra + inv_a);
               pixel[2] = (stbi__uint16) (pixel[2]*ra + inv_a);
            }
         }
      } else {
         for (i=0; i < w*h; ++i) {
            unsigned char *pixel = out + 4*i;
            if (pixel[3] != 0 && pixel[3] != 255) {
               float a = pixel[3] / 255.0f;
               float ra = 1.0f / a;
               float inv_a = 255.0f * (1 - ra);
               pixel[0] = (unsigned char) (pixel[0]*ra + inv_a);
               pixel[1] = (unsigned char) (pixel[1]*ra + inv_a);
               pixel[2] = (unsigned char) (pixel[2]*ra + inv_a);
            }
         }
      }
   }

   // convert to desired output format
   if (req_comp && req_comp != 4) {
      if (ri->bits_per_channel == 16)
         out = (stbi_uc *) stbi__convert_format16((stbi__uint16 *) out, 4, req_comp, w, h);
      else
         out = stbi__convert_format(out, 4, req_comp, w, h);
      if (out == NULL) return out; // stbi__convert_format frees input on failure
   }

   if (comp) *comp = 4;
   *y = h;
   *x = w;

   return out;
}